

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O0

SimpleString __thiscall JUnitTestOutput::createFileName(JUnitTestOutput *this,SimpleString *group)

{
  bool bVar1;
  size_t in_RDX;
  size_t extraout_RDX;
  SimpleString SVar2;
  SimpleString local_60;
  SimpleString local_50 [2];
  undefined1 local_30 [8];
  SimpleString fileName;
  SimpleString *group_local;
  JUnitTestOutput *this_local;
  
  fileName.bufferSize_ = in_RDX;
  SimpleString::SimpleString((SimpleString *)local_30,"cpputest_");
  bVar1 = SimpleString::isEmpty((SimpleString *)(group[2].buffer_ + 0x50));
  if (!bVar1) {
    SimpleString::operator+=((SimpleString *)local_30,(SimpleString *)(group[2].buffer_ + 0x50));
    SimpleString::operator+=((SimpleString *)local_30,"_");
  }
  SimpleString::operator+=((SimpleString *)local_30,(SimpleString *)fileName.bufferSize_);
  (**(code **)(group->buffer_ + 0x108))(local_50,group,local_30);
  SimpleString::SimpleString(&local_60,".xml");
  SimpleString::operator+((SimpleString *)this,local_50);
  SimpleString::~SimpleString(&local_60);
  SimpleString::~SimpleString(local_50);
  SimpleString::~SimpleString((SimpleString *)local_30);
  SVar2.bufferSize_ = extraout_RDX;
  SVar2.buffer_ = (char *)this;
  return SVar2;
}

Assistant:

SimpleString JUnitTestOutput::createFileName(const SimpleString& group)
{
    SimpleString fileName = "cpputest_";
    if (!impl_->package_.isEmpty()) {
        fileName += impl_->package_;
        fileName += "_";
    }
    fileName += group;
    return encodeFileName(fileName) + ".xml";
}